

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)28>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Result RVar2;
  VarExpr<(wabt::ExprType)28> *this_00;
  Enum EVar3;
  Var var;
  Location local_38;
  
  local_38.field_1.field_0.line = 0;
  local_38.field_1._4_8_ = 0;
  local_38.filename.data_ = (char *)0x0;
  local_38.filename.size_._0_4_ = 0;
  local_38.filename.size_._4_4_ = 0;
  Var::Var(&var,0xffffffff,&local_38);
  RVar2 = ParseVar(this,&var);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    this_00 = (VarExpr<(wabt::ExprType)28> *)operator_new(0x88);
    VarExpr<(wabt::ExprType)28>::VarExpr(this_00,&var,&loc);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    EVar3 = Ok;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
      EVar3 = Ok;
    }
  }
  Var::~Var(&var);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParsePlainInstrVar(Location loc,
                                      std::unique_ptr<Expr>* out_expr) {
  Var var;
  CHECK_RESULT(ParseVar(&var));
  out_expr->reset(new T(var, loc));
  return Result::Ok;
}